

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_readNCount_body_bmi2
                 (short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                 size_t hbSize)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint *puVar17;
  bool bVar18;
  size_t sStack_50;
  char buffer [8];
  
  if (hbSize < 8) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    memcpy(buffer,headerBuffer,hbSize);
    sVar5 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,buffer,8);
    sStack_50 = 0xffffffffffffffec;
    if (sVar5 <= hbSize) {
      sStack_50 = sVar5;
    }
    if (0xffffffffffffff88 < sVar5) {
      sStack_50 = sVar5;
    }
  }
  else {
    uVar8 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar8 * 2);
    uVar15 = *headerBuffer & 0xf;
    if (uVar15 < 0xb) {
      uVar9 = *headerBuffer >> 4;
      *tableLogPtr = uVar15 + 5;
      iVar11 = 0x20 << uVar15;
      iVar6 = iVar11 + 1;
      iVar16 = uVar15 + 6;
      puVar1 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar17 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar18 = true;
      uVar15 = 4;
      uVar12 = 0;
      puVar7 = (uint *)headerBuffer;
      do {
        uVar2 = uVar12;
        if (!bVar18) {
          while( true ) {
            uVar3 = 0;
            for (uVar12 = ~uVar9; (uVar12 & 1) == 0; uVar12 = (uVar12 | 0x80000000) >> 1) {
              uVar3 = uVar3 + 1;
            }
            if (uVar3 < 0x18) break;
            if (puVar1 < puVar7) {
              uVar15 = uVar15 + ((int)puVar7 - (int)puVar1) * 8 & 0x1f;
              puVar7 = puVar17;
            }
            else {
              puVar7 = (uint *)((long)puVar7 + 3);
            }
            uVar9 = *puVar7 >> uVar15;
            uVar2 = uVar2 + 0x24;
          }
          uVar10 = uVar9 >> (uVar3 & 0x1e) & 3;
          uVar12 = (uVar3 >> 1) * 3 + uVar2 + uVar10;
          uVar9 = uVar15 + (uVar3 & 0xfffffffe) + 2;
          if (uVar8 <= uVar12) {
            uVar12 = uVar10 + (uVar3 >> 1) * 3 + uVar2;
LAB_00139719:
            if (iVar6 != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar8 < uVar12) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)uVar9) {
              return 0xffffffffffffffec;
            }
            *maxSVPtr = uVar12 - 1;
            return (long)puVar7 + ((long)((int)(uVar9 + 7) >> 3) - (long)headerBuffer);
          }
          if ((puVar1 < puVar7) && (puVar17 < (uint *)((long)puVar7 + (ulong)(uVar9 >> 3)))) {
            uVar15 = uVar9 + ((int)puVar7 - (int)puVar17) * 8 & 0x1f;
            puVar7 = puVar17;
          }
          else {
            uVar15 = uVar9 & 7;
            puVar7 = (uint *)((long)puVar7 + (ulong)(uVar9 >> 3));
          }
          uVar9 = *puVar7 >> uVar15;
        }
        uVar2 = iVar11 * 2 - 1;
        uVar3 = uVar2 - iVar6;
        uVar10 = iVar11 - 1U & uVar9;
        if (uVar10 < uVar3) {
          iVar4 = iVar16 + -1;
        }
        else {
          uVar9 = uVar9 & uVar2;
          if ((int)uVar9 < iVar11) {
            uVar3 = 0;
          }
          uVar10 = uVar9 - uVar3;
          iVar4 = iVar16;
        }
        uVar9 = iVar4 + uVar15;
        iVar4 = uVar10 - 1;
        iVar13 = 1 - uVar10;
        if ((int)uVar10 < 1) {
          iVar13 = iVar4;
        }
        iVar6 = iVar6 + iVar13;
        uVar14 = (ulong)uVar12;
        uVar12 = uVar12 + 1;
        normalizedCounter[uVar14] = (short)iVar4;
        bVar18 = iVar4 != 0;
        if (iVar6 < iVar11) {
          if (iVar6 < 2) goto LAB_00139719;
          iVar16 = 0x20 - LZCOUNT(iVar6);
          iVar11 = 1 << ((byte)~(byte)LZCOUNT(iVar6) & 0x1f);
        }
        if (uVar8 <= uVar12) goto LAB_00139719;
        if ((puVar1 < puVar7) && (puVar17 < (uint *)((long)puVar7 + (long)((int)uVar9 >> 3)))) {
          uVar15 = uVar9 + ((int)puVar7 - (int)puVar17) * 8 & 0x1f;
          puVar7 = puVar17;
        }
        else {
          uVar15 = uVar9 & 7;
          puVar7 = (uint *)((long)puVar7 + (long)((int)uVar9 >> 3));
        }
        uVar9 = *puVar7 >> uVar15;
      } while( true );
    }
    sStack_50 = 0xffffffffffffffd4;
  }
  return sStack_50;
}

Assistant:

BMI2_TARGET_ATTRIBUTE static size_t FSE_readNCount_body_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize)
{
    return FSE_readNCount_body(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}